

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Normalize
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uchar *puVar3;
  byte *pbVar4;
  byte *pbVar5;
  reference pvVar6;
  Image *in_RCX;
  uint32_t in_EDX;
  uint32_t unaff_EBX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  uint16_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  double correction;
  uint8_t *inXEnd;
  uint8_t *inX;
  uint32_t realWidth;
  uint8_t maximum;
  uint8_t minimum;
  uint8_t *inYEnd;
  uint8_t *inY;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  value_type in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 *__n;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff72;
  ushort uVar10;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff98;
  byte *local_50;
  byte local_42;
  byte local_41;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar11;
  byte bVar12;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff74,
                      CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
             (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98
            );
  uVar1 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    ((ImageTemplate<unsigned_char> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  uVar11 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffd4);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  puVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  bVar12 = (byte)((uint)uVar11 >> 0x18);
  pbVar4 = puVar3 + (ulong)(in_ESI * bVar12) + (ulong)(in_EDX * uVar2);
  pbVar5 = pbVar4 + in_stack_00000010 * uVar2;
  local_41 = 0xff;
  local_42 = 0;
  for (; pbVar4 != pbVar5; pbVar4 = pbVar4 + uVar2) {
    for (local_50 = pbVar4; local_50 != pbVar4 + in_stack_00000008 * bVar12; local_50 = local_50 + 1
        ) {
      if (*local_50 < local_41) {
        local_41 = *local_50;
      }
      if (local_42 < *local_50) {
        local_42 = *local_50;
      }
    }
  }
  if (((local_41 == 0) && (local_42 == 0xff)) || (local_41 == local_42)) {
    Copy(in_RCX,in_R8D,in_R9D,(Image *)CONCAT44(uVar11,uVar2),(uint32_t)((ulong)pbVar4 >> 0x20),
         (uint32_t)pbVar4,(uint32_t)in_RDI,unaff_EBX);
  }
  else {
    auVar7._0_8_ = 255.0 / (double)(int)((uint)local_42 - (uint)local_41);
    auVar8 = ZEXT864((ulong)auVar7._0_8_);
    __n = &stack0xffffffffffffff87;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x124b1d);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT22(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
               (size_type)__n,
               (allocator_type *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x124b3d);
    for (uVar10 = 0; uVar10 < 0x100; uVar10 = uVar10 + 1) {
      auVar9._0_8_ = (double)(int)((uint)uVar10 - (uint)local_41);
      auVar9._8_8_ = auVar8._8_8_;
      auVar7._8_8_ = 0;
      auVar9 = vfmadd213sd_fma(auVar7,auVar9,ZEXT816(0x3fe0000000000000));
      auVar8 = ZEXT1664(auVar9);
      in_stack_ffffffffffffff67 = (value_type)(int)auVar9._0_8_;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stack0xffffffffffffff88,(ulong)uVar10);
      *pvVar6 = in_stack_ffffffffffffff67;
    }
    LookupTable(in_RDI,in_ESI,in_EDX,in_RCX,in_R8D,in_R9D,unaff_retaddr,in_stack_00000008,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                CONCAT44(in_stack_00000014,in_stack_00000010));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  return;
}

Assistant:

void Normalize( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount = CommonColorCount( in, out );
        const uint32_t rowSizeIn = in.rowSize();

        const uint8_t * inY    = in.data()  + startYIn  * rowSizeIn + startXIn * colorCount;
        const uint8_t * inYEnd = inY + height * rowSizeIn;

        uint8_t minimum = 255;
        uint8_t maximum = 0;

        const uint32_t realWidth = width * colorCount;

        for( ; inY != inYEnd; inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            const uint8_t * inXEnd = inX + realWidth;

            for( ; inX != inXEnd; ++inX ) {
                if( minimum > (*inX) )
                    minimum = (*inX);

                if( maximum < (*inX) )
                    maximum = (*inX);
            }
        }

        if( (minimum == 0 && maximum == 255) || (minimum == maximum) ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const double correction = 255.0 / (maximum - minimum);

            // We precalculate all values and store them in lookup table
            std::vector < uint8_t > value( 256 );

            for( uint16_t i = 0; i < 256; ++i )
                value[i] = static_cast <uint8_t>((i - minimum) * correction + 0.5);

            LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
        }
    }